

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

void __thiscall CClient::RegisterInterfaces(CClient *this)

{
  IKernel *pIVar1;
  
  pIVar1 = (this->super_IClient).super_IInterface.m_pKernel;
  (**pIVar1->_vptr_IKernel)(pIVar1,"demorecorder",&this->m_DemoRecorder);
  pIVar1 = (this->super_IClient).super_IInterface.m_pKernel;
  (**pIVar1->_vptr_IKernel)(pIVar1,"demoplayer",&this->m_DemoPlayer);
  pIVar1 = (this->super_IClient).super_IInterface.m_pKernel;
  (**pIVar1->_vptr_IKernel)(pIVar1,"serverbrowser",&this->m_ServerBrowser);
  pIVar1 = (this->super_IClient).super_IInterface.m_pKernel;
  (**pIVar1->_vptr_IKernel)(pIVar1,"friends",&this->m_Friends);
  pIVar1 = (this->super_IClient).super_IInterface.m_pKernel;
  (**pIVar1->_vptr_IKernel)(pIVar1,"blacklist",&this->m_Blacklist);
  return;
}

Assistant:

void CClient::RegisterInterfaces()
{
	Kernel()->RegisterInterface(static_cast<IDemoRecorder*>(&m_DemoRecorder));
	Kernel()->RegisterInterface(static_cast<IDemoPlayer*>(&m_DemoPlayer));
	Kernel()->RegisterInterface(static_cast<IServerBrowser*>(&m_ServerBrowser));
	Kernel()->RegisterInterface(static_cast<IFriends*>(&m_Friends));
	Kernel()->RegisterInterface(static_cast<IBlacklist*>(&m_Blacklist));
}